

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afhints.c
# Opt level: O0

void af_glyph_hints_align_edge_points(AF_GlyphHints hints,AF_Dimension dim)

{
  long lVar1;
  AF_Segment pAVar2;
  AF_Edge_conflict local_80;
  AF_Point_conflict last_1;
  AF_Point_conflict first_1;
  AF_Point_conflict point_1;
  AF_Edge_conflict edge_1;
  AF_Point_conflict last;
  AF_Point_conflict first;
  AF_Point_conflict point;
  AF_Edge_conflict edge;
  AF_Segment_conflict seg;
  AF_Segment_conflict segment_limit;
  AF_Segment_conflict segments;
  AF_AxisHints axis;
  AF_Dimension dim_local;
  AF_GlyphHints hints_local;
  
  edge = (AF_Edge_conflict)hints->axis[dim].segments;
  if (edge == (AF_Edge_conflict)0x0) {
    local_80 = (AF_Edge_conflict)0x0;
  }
  else {
    local_80 = (AF_Edge_conflict)(&edge->fpos + (ulong)hints->axis[dim].num_segments * 0x28);
  }
  if (dim == AF_DIMENSION_HORZ) {
    for (; edge < local_80; edge = (AF_Edge_conflict)&edge->last) {
      lVar1 = edge->pos;
      if (lVar1 != 0) {
        first = *(AF_Point_conflict *)&edge->score;
        pAVar2 = edge->first;
        while( true ) {
          first->x = *(FT_Pos *)(lVar1 + 0x10);
          first->flags = first->flags | 4;
          if ((AF_Segment)first == pAVar2) break;
          first = first->next;
        }
      }
    }
  }
  else {
    for (; edge < local_80; edge = (AF_Edge_conflict)&edge->last) {
      lVar1 = edge->pos;
      if (lVar1 != 0) {
        first_1 = *(AF_Point_conflict *)&edge->score;
        pAVar2 = edge->first;
        while( true ) {
          first_1->y = *(FT_Pos *)(lVar1 + 0x10);
          first_1->flags = first_1->flags | 8;
          if ((AF_Segment)first_1 == pAVar2) break;
          first_1 = first_1->next;
        }
      }
    }
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  af_glyph_hints_align_edge_points( AF_GlyphHints  hints,
                                    AF_Dimension   dim )
  {
    AF_AxisHints  axis          = & hints->axis[dim];
    AF_Segment    segments      = axis->segments;
    AF_Segment    segment_limit = FT_OFFSET( segments, axis->num_segments );
    AF_Segment    seg;


    if ( dim == AF_DIMENSION_HORZ )
    {
      for ( seg = segments; seg < segment_limit; seg++ )
      {
        AF_Edge   edge = seg->edge;
        AF_Point  point, first, last;


        if ( !edge )
          continue;

        first = seg->first;
        last  = seg->last;
        point = first;
        for (;;)
        {
          point->x      = edge->pos;
          point->flags |= AF_FLAG_TOUCH_X;

          if ( point == last )
            break;

          point = point->next;
        }
      }
    }
    else
    {
      for ( seg = segments; seg < segment_limit; seg++ )
      {
        AF_Edge   edge = seg->edge;
        AF_Point  point, first, last;


        if ( !edge )
          continue;

        first = seg->first;
        last  = seg->last;
        point = first;
        for (;;)
        {
          point->y      = edge->pos;
          point->flags |= AF_FLAG_TOUCH_Y;

          if ( point == last )
            break;

          point = point->next;
        }
      }
    }
  }